

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O0

void x11_format_auth_for_authfile
               (BinarySink *bs,SockAddr *addr,int display_no,ptrlen authproto,ptrlen authdata)

{
  BinarySink *pBVar1;
  _Bool _Var2;
  int iVar3;
  char *pcVar4;
  ptrlen pVar5;
  char *numberbuf;
  char local_78 [8];
  char ipv6buf [16];
  char local_4c [4];
  undefined1 auStack_48 [4];
  char ipv4buf [4];
  char *ourhostname;
  int display_no_local;
  SockAddr *addr_local;
  BinarySink *bs_local;
  ptrlen authproto_local;
  
  _Var2 = sk_address_is_special_local(addr);
  if (_Var2) {
    pcVar4 = get_hostname();
    BinarySink_put_uint16(bs->binarysink_,0x100);
    pBVar1 = bs->binarysink_;
    _auStack_48 = ptrlen_from_asciz(pcVar4);
    BinarySink_put_stringpl_xauth(pBVar1,_auStack_48);
    safefree(pcVar4);
  }
  else {
    iVar3 = sk_addrtype(addr);
    if (iVar3 == 1) {
      sk_addrcopy(addr,local_4c);
      BinarySink_put_uint16(bs->binarysink_,0);
      pBVar1 = bs->binarysink_;
      pVar5 = make_ptrlen(local_4c,4);
      BinarySink_put_stringpl_xauth(pBVar1,pVar5);
    }
    else {
      iVar3 = sk_addrtype(addr);
      if (iVar3 != 2) {
        __assert_fail("false && \"Bad address type in x11_format_auth_for_authfile\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/x11authfile.c"
                      ,0xe9,
                      "void x11_format_auth_for_authfile(BinarySink *, SockAddr *, int, ptrlen, ptrlen)"
                     );
      }
      sk_addrcopy(addr,local_78);
      BinarySink_put_uint16(bs->binarysink_,6);
      pBVar1 = bs->binarysink_;
      pVar5 = make_ptrlen(local_78,0x10);
      BinarySink_put_stringpl_xauth(pBVar1,pVar5);
    }
  }
  pcVar4 = dupprintf("%d",(ulong)(uint)display_no);
  pBVar1 = bs->binarysink_;
  pVar5 = ptrlen_from_asciz(pcVar4);
  BinarySink_put_stringpl_xauth(pBVar1,pVar5);
  safefree(pcVar4);
  BinarySink_put_stringpl_xauth(bs->binarysink_,authproto);
  BinarySink_put_stringpl_xauth(bs->binarysink_,authdata);
  return;
}

Assistant:

void x11_format_auth_for_authfile(
    BinarySink *bs, SockAddr *addr, int display_no,
    ptrlen authproto, ptrlen authdata)
{
    if (sk_address_is_special_local(addr)) {
        char *ourhostname = get_hostname();
        put_uint16(bs, 256); /* indicates Unix-domain socket */
        put_stringpl_xauth(bs, ptrlen_from_asciz(ourhostname));
        sfree(ourhostname);
    } else if (sk_addrtype(addr) == ADDRTYPE_IPV4) {
        char ipv4buf[4];
        sk_addrcopy(addr, ipv4buf);
        put_uint16(bs, 0); /* indicates IPv4 */
        put_stringpl_xauth(bs, make_ptrlen(ipv4buf, 4));
    } else if (sk_addrtype(addr) == ADDRTYPE_IPV6) {
        char ipv6buf[16];
        sk_addrcopy(addr, ipv6buf);
        put_uint16(bs, 6); /* indicates IPv6 */
        put_stringpl_xauth(bs, make_ptrlen(ipv6buf, 16));
    } else {
        unreachable("Bad address type in x11_format_auth_for_authfile");
    }

    {
        char *numberbuf = dupprintf("%d", display_no);
        put_stringpl_xauth(bs, ptrlen_from_asciz(numberbuf));
        sfree(numberbuf);
    }

    put_stringpl_xauth(bs, authproto);
    put_stringpl_xauth(bs, authdata);
}